

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void GC::CheckArray(char *ptr,ExternTypeInfo *type)

{
  ExternTypeInfo *elementType;
  
  if ((type->field_8).arrSize != 0xffffffff) {
    elementType = FastVector<ExternTypeInfo,_false,_false>::operator[]
                            ((FastVector<ExternTypeInfo,_false,_false> *)
                             (NULLC::commonLinker + 0x200),(type->field_11).subType);
    CheckArrayElements(ptr,(type->field_8).arrSize,elementType);
    return;
  }
  if (*(long *)ptr != 0) {
    CheckPointer(ptr);
    return;
  }
  return;
}

Assistant:

void CheckArray(char* ptr, const ExternTypeInfo& type)
	{
		// If array type is an unsized array, check pointer that points to actual array contents
		if(type.arrSize == ~0u)
		{
			NULLCArray *data = (NULLCArray*)ptr;

			// Skip uninitialized array
			if(!data->ptr)
				return;

			CheckPointer((char*)&data->ptr);
		}
		else
		{
			// Get array element type
			ExternTypeInfo *subType = &NULLC::commonLinker->exTypes[type.subType];

			CheckArrayElements(ptr, type.arrSize, *subType);
		}
	}